

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomMesh *mesh,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *this_00;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
  *this_01;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *pTVar3;
  TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *this_02;
  value_type *pvVar4;
  value_type *pvVar5;
  map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
  *this_03;
  TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *pTVar6;
  TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *attr;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
  *attr_00;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
  *attr_01;
  uint32_t indent_00;
  string *psVar7;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t uVar8;
  uint32_t n_02;
  FamilyType v;
  uint32_t n_03;
  undefined7 in_register_00000081;
  string *name;
  string local_840;
  string local_820;
  string local_800;
  allocator local_7d9;
  string local_7d8;
  string local_7b8;
  allocator local_791;
  string local_790;
  string local_770;
  allocator local_749;
  string local_748;
  string local_728;
  allocator local_701;
  undefined1 local_700 [32];
  string local_6e0;
  allocator local_6b9;
  undefined1 local_6b8 [32];
  string local_698;
  allocator local_671;
  undefined1 local_670 [32];
  string local_650;
  allocator local_629;
  undefined1 local_628 [32];
  string local_608;
  allocator local_5e1;
  undefined1 local_5e0 [32];
  string local_5c0;
  allocator local_599;
  undefined1 local_598 [32];
  string local_578;
  allocator local_551;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0 [8];
  string attr_name;
  pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType> *item;
  const_iterator __end1;
  const_iterator __begin1;
  map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
  *__range1;
  string local_468;
  ListEditQual local_444;
  string local_440;
  allocator local_419;
  undefined1 local_418 [32];
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  ListEditQual local_3ac;
  string local_3a8;
  allocator local_381;
  undefined1 local_380 [32];
  string local_360;
  allocator local_339;
  undefined1 local_338 [32];
  string local_318;
  allocator local_2f1;
  undefined1 local_2f0 [32];
  string local_2d0;
  allocator local_2a9;
  undefined1 local_2a8 [32];
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  GeomMesh *pGStack_18;
  uint32_t indent_local;
  GeomMesh *mesh_local;
  
  name = (string *)CONCAT71(in_register_00000081,closing_brace);
  local_1c = (uint)mesh;
  local_1d = (byte)indent & 1;
  psVar7 = __return_storage_ptr__;
  pGStack_18 = (GeomMesh *)this;
  mesh_local = (GeomMesh *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar7;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)(pGStack_18->super_GPrim).spec,s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2," Mesh \"");
  poVar2 = ::std::operator<<(poVar2,(string *)&(pGStack_18->super_GPrim).name);
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored(&(pGStack_18->super_GPrim).meta);
  uVar8 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)&(pGStack_18->super_GPrim).meta,
               (PrimMeta *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    uVar8 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,uVar8);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  this_00 = &pGStack_18->points;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2a8,"points",&local_2a9);
  print_typed_attr<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            ((string *)(local_2a8 + 0x20),(tinyusdz *)this_00,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              *)local_2a8,(string *)(ulong)(local_1c + 1),(uint32_t)name);
  ::std::operator<<(aoStack_198,(string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  this_01 = &pGStack_18->normals;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2f0,"normals",&local_2f1);
  print_typed_attr<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
            ((string *)(local_2f0 + 0x20),(tinyusdz *)this_01,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              *)local_2f0,(string *)(ulong)(local_1c + 1),(uint32_t)name);
  ::std::operator<<(aoStack_198,(string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  pTVar3 = &pGStack_18->faceVertexIndices;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_338,"faceVertexIndices",&local_339);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_338 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_338,(string *)(ulong)(local_1c + 1),(uint32_t)name);
  ::std::operator<<(aoStack_198,(string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)local_338);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
  pTVar3 = &pGStack_18->faceVertexCounts;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_380,"faceVertexCounts",&local_381);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_380 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_380,(string *)(ulong)(local_1c + 1),(uint32_t)name);
  ::std::operator<<(aoStack_198,(string *)(local_380 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_380 + 0x20));
  ::std::__cxx11::string::~string((string *)local_380);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pGStack_18->skeleton);
  if (bVar1) {
    pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(&pGStack_18->skeleton);
    pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(&pGStack_18->skeleton);
    local_3ac = Relationship::get_listedit_qual(pvVar5);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3d0,"skel:skeleton",&local_3d1);
    name = &local_3d0;
    anon_unknown_173::print_relationship(&local_3a8,pvVar4,&local_3ac,false,name,local_1c + 1);
    ::std::operator<<(aoStack_198,(string *)&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3d0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  }
  this_02 = &pGStack_18->blendShapes;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_418,"skel:blendShapes",&local_419);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            ((string *)(local_418 + 0x20),(tinyusdz *)this_02,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_418,(string *)(ulong)(local_1c + 1),(uint32_t)name);
  ::std::operator<<(aoStack_198,(string *)(local_418 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_418 + 0x20));
  ::std::__cxx11::string::~string((string *)local_418);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_419);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pGStack_18->blendShapeTargets);
  if (bVar1) {
    pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       (&pGStack_18->blendShapeTargets);
    pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                       (&pGStack_18->blendShapeTargets);
    local_444 = Relationship::get_listedit_qual(pvVar5);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_468,"skel:blendShapeTargets",(allocator *)((long)&__range1 + 7));
    name = &local_468;
    anon_unknown_173::print_relationship(&local_440,pvVar4,&local_444,false,name,local_1c + 1);
    ::std::operator<<(aoStack_198,(string *)&local_440);
    ::std::__cxx11::string::~string((string *)&local_440);
    ::std::__cxx11::string::~string((string *)&local_468);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  this_03 = &pGStack_18->subsetFamilyTypeMap;
  __end1 = ::std::
           map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
           ::begin(this_03);
  item = (pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType> *)
         ::std::
         map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
         ::end(this_03);
  while( true ) {
    bVar1 = ::std::operator!=(&__end1,(_Self *)&item);
    uVar8 = (uint32_t)name;
    if (!bVar1) break;
    attr_name.field_2._8_8_ =
         ::std::
         _Rb_tree_const_iterator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>
         ::operator*(&__end1);
    Token::str_abi_cxx11_((Token *)attr_name.field_2._8_8_);
    ::std::operator+((char *)local_4d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "subsetFamily:");
    ::std::operator+(local_4b0,(char *)local_4d0);
    ::std::__cxx11::string::~string(local_4d0);
    pprint::Indent_abi_cxx11_(&local_4f0,(pprint *)(ulong)(local_1c + 1),n_02);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_4f0);
    poVar2 = ::std::operator<<(poVar2,"uniform token ");
    poVar2 = ::std::operator<<(poVar2,(string *)local_4b0);
    poVar2 = ::std::operator<<(poVar2," = ");
    to_string_abi_cxx11_(&local_530,(tinyusdz *)(ulong)*(uint *)(attr_name.field_2._8_8_ + 0x20),v);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_550,"\"",&local_551);
    quote(&local_510,&local_530,&local_550);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_510);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_510);
    ::std::__cxx11::string::~string((string *)&local_550);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_551);
    ::std::__cxx11::string::~string((string *)&local_530);
    ::std::__cxx11::string::~string((string *)&local_4f0);
    ::std::__cxx11::string::~string((string *)local_4b0);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>::
    operator++(&__end1);
  }
  pTVar3 = &pGStack_18->cornerIndices;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_598,"cornerIndices",&local_599);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_598 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_598,(string *)(ulong)(local_1c + 1),uVar8);
  ::std::operator<<(aoStack_198,(string *)(local_598 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_598 + 0x20));
  ::std::__cxx11::string::~string((string *)local_598);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_599);
  pTVar6 = &pGStack_18->cornerSharpnesses;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_5e0,"cornerSharpnesses",&local_5e1);
  print_typed_attr<std::vector<float,std::allocator<float>>>
            ((string *)(local_5e0 + 0x20),(tinyusdz *)pTVar6,
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_5e0,(string *)(ulong)(local_1c + 1),uVar8);
  ::std::operator<<(aoStack_198,(string *)(local_5e0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_5e0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_5e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  pTVar3 = &pGStack_18->creaseIndices;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_628,"creaseIndices",&local_629);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_628 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_628,(string *)(ulong)(local_1c + 1),uVar8);
  ::std::operator<<(aoStack_198,(string *)(local_628 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_628 + 0x20));
  ::std::__cxx11::string::~string((string *)local_628);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_629);
  pTVar3 = &pGStack_18->creaseLengths;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_670,"creaseLengths",&local_671);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_670 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_670,(string *)(ulong)(local_1c + 1),uVar8);
  ::std::operator<<(aoStack_198,(string *)(local_670 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_670 + 0x20));
  ::std::__cxx11::string::~string((string *)local_670);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_671);
  pTVar6 = &pGStack_18->creaseSharpnesses;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_6b8,"creaseSharpnesses",&local_6b9);
  print_typed_attr<std::vector<float,std::allocator<float>>>
            ((string *)(local_6b8 + 0x20),(tinyusdz *)pTVar6,
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_6b8,(string *)(ulong)(local_1c + 1),uVar8);
  ::std::operator<<(aoStack_198,(string *)(local_6b8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_6b8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_6b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  pTVar3 = &pGStack_18->holeIndices;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_700,"holeIndices",&local_701);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_700 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_700,(string *)(ulong)(local_1c + 1),uVar8);
  ::std::operator<<(aoStack_198,(string *)(local_700 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_700 + 0x20));
  ::std::__cxx11::string::~string((string *)local_700);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_701);
  attr = &pGStack_18->subdivisionScheme;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_748,"subdivisonScheme",&local_749);
  print_typed_token_attr<tinyusdz::GeomMesh::SubdivisionScheme>
            (&local_728,attr,&local_748,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_728);
  ::std::__cxx11::string::~string((string *)&local_728);
  ::std::__cxx11::string::~string((string *)&local_748);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_749);
  attr_00 = &pGStack_18->interpolateBoundary;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_790,"interpolateBoundary",&local_791);
  print_typed_token_attr<tinyusdz::GeomMesh::InterpolateBoundary>
            (&local_770,attr_00,&local_790,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_770);
  ::std::__cxx11::string::~string((string *)&local_770);
  ::std::__cxx11::string::~string((string *)&local_790);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_791);
  attr_01 = &pGStack_18->faceVaryingLinearInterpolation;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_7d8,"faceVaryingLinearInterpolation",&local_7d9);
  print_typed_token_attr<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
            (&local_7b8,attr_01,&local_7d8,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_7b8);
  ::std::__cxx11::string::~string((string *)&local_7b8);
  ::std::__cxx11::string::~string((string *)&local_7d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  print_gprim_predefined<tinyusdz::GeomMesh>(&local_800,pGStack_18,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_800);
  ::std::__cxx11::string::~string((string *)&local_800);
  print_props(&local_820,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)&(pGStack_18->super_GPrim).props,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_820);
  ::std::__cxx11::string::~string((string *)&local_820);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_840,(pprint *)(ulong)local_1c,n_03);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_840);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_840);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomMesh &mesh, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(mesh.spec) << " Mesh \""
     << mesh.name << "\"\n";
  if (mesh.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(mesh.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(mesh.points, "points", indent + 1);
  ss << print_typed_attr(mesh.normals, "normals", indent + 1);
  ss << print_typed_attr(mesh.faceVertexIndices, "faceVertexIndices",
                         indent + 1);
  ss << print_typed_attr(mesh.faceVertexCounts, "faceVertexCounts", indent + 1);

  if (mesh.skeleton) {
    ss << print_relationship(mesh.skeleton.value(),
                             mesh.skeleton.value().get_listedit_qual(),
                             /* custom */ false, "skel:skeleton", indent + 1);
  }

  ss << print_typed_attr(mesh.blendShapes, "skel:blendShapes", indent + 1);
  if (mesh.blendShapeTargets) {
    ss << print_relationship(mesh.blendShapeTargets.value(),
                             mesh.blendShapeTargets.value().get_listedit_qual(),
                             /* custom */ false, "skel:blendShapeTargets",
                             indent + 1);
  }

  for (const auto &item : mesh.subsetFamilyTypeMap) {
    std::string attr_name = "subsetFamily:" + item.first.str() + ":familyType";
    // TODO: Support connection attr?
    ss << pprint::Indent(indent+1) << "uniform token " << attr_name << " = " << quote(to_string(item.second)) << "\n";
  }

  // subdiv
  ss << print_typed_attr(mesh.cornerIndices, "cornerIndices", indent + 1);
  ss << print_typed_attr(mesh.cornerSharpnesses, "cornerSharpnesses",
                         indent + 1);
  ss << print_typed_attr(mesh.creaseIndices, "creaseIndices", indent + 1);
  ss << print_typed_attr(mesh.creaseLengths, "creaseLengths", indent + 1);
  ss << print_typed_attr(mesh.creaseSharpnesses, "creaseSharpnesses",
                         indent + 1);
  ss << print_typed_attr(mesh.holeIndices, "holeIndices", indent + 1);

  ss << print_typed_token_attr(mesh.subdivisionScheme, "subdivisonScheme",
                               indent + 1);
  ss << print_typed_token_attr(mesh.interpolateBoundary, "interpolateBoundary",
                               indent + 1);
  ss << print_typed_token_attr(mesh.faceVaryingLinearInterpolation,
                               "faceVaryingLinearInterpolation", indent + 1);

  ss << print_gprim_predefined(mesh, indent + 1);

#if 0
  // GeomSubset.
  for (const auto &subset : mesh.geom_subset_children) {
    ss << to_string(subset, indent + 1, /* closing_brace */ true);
  }
#endif

  ss << print_props(mesh.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}